

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O0

void __thiscall
jbcoin::STValidation::STValidation
          (STValidation *this,uint256 *ledgerHash,time_point signTime,PublicKey *publicKey,
          bool isFull)

{
  bool bVar1;
  rep_conflict v;
  SOTemplate *type;
  NodeID local_64;
  Slice local_50;
  duration<unsigned_int,_std::ratio<1L,_1L>_> local_40 [5];
  byte local_29;
  PublicKey *pPStack_28;
  bool isFull_local;
  PublicKey *publicKey_local;
  uint256 *ledgerHash_local;
  STValidation *this_local;
  time_point signTime_local;
  
  local_29 = isFull;
  pPStack_28 = publicKey;
  publicKey_local = (PublicKey *)ledgerHash;
  ledgerHash_local = (uint256 *)this;
  this_local._4_4_ = signTime.__d.__r;
  type = getFormat();
  STObject::STObject(&this->super_STObject,type,(SField *)sfValidation);
  CountedObject<jbcoin::STValidation>::CountedObject((CountedObject<jbcoin::STValidation> *)this);
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STValidation_0051b060;
  base_uint<160UL,_jbcoin::detail::NodeIDTag>::base_uint(&this->mNodeID);
  this->mTrusted = false;
  (this->mSeen).__d.__r = (rep_conflict)this_local._4_4_;
  STObject::setFieldH256(&this->super_STObject,(SField *)sfLedgerHash,(uint256 *)publicKey_local);
  local_40[0].__r =
       (rep_conflict)
       std::chrono::
       time_point<jbcoin::NetClock,_std::chrono::duration<unsigned_int,_std::ratio<1L,_1L>_>_>::
       time_since_epoch((time_point<jbcoin::NetClock,_std::chrono::duration<unsigned_int,_std::ratio<1L,_1L>_>_>
                         *)((long)&this_local + 4));
  v = std::chrono::duration<unsigned_int,_std::ratio<1L,_1L>_>::count(local_40);
  STObject::setFieldU32(&this->super_STObject,(SField *)sfSigningTime,v);
  local_50 = PublicKey::slice(pPStack_28);
  STObject::setFieldVL(&this->super_STObject,(SField *)sfSigningPubKey,&local_50);
  calcNodeID(&local_64,pPStack_28);
  base_uint<160UL,_jbcoin::detail::NodeIDTag>::operator=(&this->mNodeID,&local_64);
  bVar1 = base_uint<160UL,_jbcoin::detail::NodeIDTag>::isNonZero(&this->mNodeID);
  if (!bVar1) {
    __assert_fail("mNodeID.isNonZero ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STValidation.cpp"
                  ,0x3a,
                  "jbcoin::STValidation::STValidation(const uint256 &, NetClock::time_point, const PublicKey &, bool)"
                 );
  }
  if ((local_29 & 1) != 0) {
    STObject::setFlag(&this->super_STObject,1);
  }
  return;
}

Assistant:

STValidation::STValidation (
        uint256 const& ledgerHash,
        NetClock::time_point signTime,
        PublicKey const& publicKey,
        bool isFull)
    : STObject (getFormat (), sfValidation)
    , mSeen (signTime)
{
    // Does not sign
    setFieldH256 (sfLedgerHash, ledgerHash);
    setFieldU32 (sfSigningTime, signTime.time_since_epoch().count());

    setFieldVL (sfSigningPubKey, publicKey.slice());
    mNodeID = calcNodeID(publicKey);
    assert (mNodeID.isNonZero ());

    if (isFull)
        setFlag (kFullFlag);
}